

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Var * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,Identifier **args_2)

{
  Var *lr;
  Fodder *in_RDI;
  Var *r;
  Identifier *in_stack_ffffffffffffffa8;
  Var *in_stack_ffffffffffffffc0;
  
  lr = (Var *)operator_new(0x88);
  Var::Var(in_stack_ffffffffffffffc0,(LocationRange *)lr,in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)lr,
             (value_type *)lr);
  return lr;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }